

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModportSubroutinePortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportSubroutinePortSyntax,slang::syntax::FunctionPrototypeSyntax&>
          (BumpAllocator *this,FunctionPrototypeSyntax *args)

{
  ModportSubroutinePortSyntax *pMVar1;
  FunctionPrototypeSyntax *in_RDI;
  ModportSubroutinePortSyntax *unaff_retaddr;
  
  pMVar1 = (ModportSubroutinePortSyntax *)
           allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  slang::syntax::ModportSubroutinePortSyntax::ModportSubroutinePortSyntax(unaff_retaddr,in_RDI);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }